

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O2

void cnn::RemoveArgs(int *argc,char ***argv,int *argi,int n)

{
  int iVar1;
  long lVar2;
  
  iVar1 = *argc;
  for (lVar2 = (long)(*argi + 2); lVar2 < iVar1; lVar2 = lVar2 + 1) {
    (*argv)[lVar2 + -2] = (*argv)[lVar2];
  }
  *argc = iVar1 + -2;
  if (1 < iVar1) {
    return;
  }
  __assert_fail("argc >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/init.cc"
                ,0x1c,"void cnn::RemoveArgs(int &, char **&, int &, int)");
}

Assistant:

static void RemoveArgs(int& argc, char**& argv, int& argi, int n) {
  for (int i = argi + n; i < argc; ++i)
    argv[i - n] = argv[i];
  argc -= n;
  assert(argc >= 0);
}